

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::applyFilters
          (FilterCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *filters)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum GVar3;
  code *pcVar4;
  ulong uVar5;
  MessageFilter *pMVar6;
  bool bVar7;
  int iVar8;
  TestLog *log_00;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  MessageFilter *pMVar10;
  char *pcVar11;
  size_type sVar12;
  MessageBuilder *pMVar13;
  const_reference pvVar14;
  Enum<int,_2UL> EVar15;
  const_reference local_518;
  char *local_428;
  MessageID local_41c;
  MessageBuilder local_410;
  ulong local_290;
  size_t ndx;
  GetNameFunc local_280;
  int local_278;
  Enum<int,_2UL> local_270;
  GetNameFunc local_260;
  int local_258;
  Enum<int,_2UL> local_250;
  GetNameFunc local_240;
  int local_238;
  Enum<int,_2UL> local_230;
  MessageBuilder local_220;
  const_reference local_a0;
  MessageFilter *filter;
  size_t filterNdx;
  Functions *gl;
  string local_80;
  allocator<char> local_49;
  string local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  TestLog *log;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *filters_local;
  FilterCase *this_local;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  section.m_log = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Setting message filters",(allocator<char> *)((long)&gl + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_28,log_00,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pRVar9 = gles31::Context::getRenderContext
                     ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  iVar8 = (*pRVar9->_vptr_RenderContext[3])();
  filterNdx = CONCAT44(extraout_var,iVar8);
  for (filter = (MessageFilter *)0x0; pMVar6 = filter,
      pMVar10 = (MessageFilter *)
                std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                ::size(filters), pMVar6 < pMVar10;
      filter = (MessageFilter *)((long)&filter->source + 1)) {
    local_a0 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               ::operator[](filters,(size_type)filter);
    bVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&local_a0->ids);
    if (bVar7) {
      tcu::TestLog::operator<<(&local_220,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar13 = tcu::MessageBuilder::operator<<(&local_220,(char (*) [22])"Setting messages with");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [9])" source ");
      EVar15 = glu::getDebugMessageSourceStr(local_a0->source);
      local_240 = EVar15.m_getName;
      local_238 = EVar15.m_value;
      local_230.m_getName = local_240;
      local_230.m_value = local_238;
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_230);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [8])", type ");
      EVar15 = glu::getDebugMessageTypeStr(local_a0->type);
      local_260 = EVar15.m_getName;
      local_258 = EVar15.m_value;
      local_250.m_getName = local_260;
      local_250.m_value = local_258;
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_250);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [15])" and severity ");
      EVar15 = glu::getDebugMessageSeverityStr(local_a0->severity);
      local_280 = EVar15.m_getName;
      local_278 = EVar15.m_value;
      local_270.m_getName = local_280;
      local_270.m_value = local_278;
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_270);
      pcVar11 = " to disabled";
      if ((local_a0->enabled & 1U) != 0) {
        pcVar11 = " to enabled";
      }
      ndx = (size_t)pcVar11;
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char **)&ndx);
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_220);
    }
    else {
      for (local_290 = 0; uVar5 = local_290,
          sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_a0->ids),
          uVar5 < sVar12; local_290 = local_290 + 1) {
        tcu::TestLog::operator<<
                  (&local_410,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<(&local_410,(char (*) [18])"Setting message (");
        GVar1 = local_a0->source;
        GVar2 = local_a0->type;
        pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_a0->ids,local_290);
        MessageID::MessageID(&local_41c,GVar1,GVar2,*pvVar14);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_41c);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [6])") to ");
        local_428 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
        if ((local_a0->enabled & 1U) != 0) {
          local_428 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
        }
        local_428 = local_428 + 0x27;
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_428);
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_410);
      }
    }
    pcVar4 = *(code **)(filterNdx + 0x428);
    GVar1 = local_a0->source;
    GVar2 = local_a0->type;
    GVar3 = local_a0->severity;
    sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_a0->ids);
    bVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&local_a0->ids);
    if (bVar7) {
      local_518 = (const_reference)0x0;
    }
    else {
      local_518 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_a0->ids,0);
    }
    (*pcVar4)(GVar1,GVar2,GVar3,sVar12 & 0xffffffff,local_518,local_a0->enabled & 1);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  return;
}

Assistant:

void FilterCase::applyFilters (const vector<MessageFilter>& filters) const
{
	TestLog&					log		= m_testCtx.getLog();
	const tcu::ScopedLogSection	section	(log, "", "Setting message filters");
	const glw::Functions&		gl		= m_context.getRenderContext().getFunctions();

	for (size_t filterNdx = 0; filterNdx < filters.size(); filterNdx++)
	{
		const MessageFilter& filter = filters[filterNdx];

		if (filter.ids.empty())
			log << TestLog::Message << "Setting messages with"
				<< " source " << glu::getDebugMessageSourceStr(filter.source)
				<< ", type " << glu::getDebugMessageTypeStr(filter.type)
				<< " and severity " << glu::getDebugMessageSeverityStr(filter.severity)
				<< (filter.enabled ? " to enabled" : " to disabled")
				<< TestLog::EndMessage;
		else
		{
			for (size_t ndx = 0; ndx < filter.ids.size(); ndx++)
				log << TestLog::Message << "Setting message (" << MessageID(filter.source, filter.type, filter.ids[ndx]) << ") to " << (filter.enabled ? "enabled" : "disabled") << TestLog::EndMessage;
		}

		gl.debugMessageControl(filter.source, filter.type, filter.severity, GLsizei(filter.ids.size()), filter.ids.empty() ? DE_NULL : &filter.ids[0], filter.enabled);
	}
}